

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O2

int testString(int param_1,char **param_2)

{
  size_t sVar1;
  bool bVar2;
  type tVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  string *psVar8;
  initializer_list<char> il;
  initializer_list<char> il_00;
  char *null;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  char *null_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200 [3];
  String str;
  allocator<char> local_69;
  char *c_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60 [6];
  
  std::operator<<((ostream *)&std::cout,"testConstructDefault()\n");
  str.view_ = (string_view)ZEXT816(0);
  str.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  str.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = cm::String::is_stable(&str);
  if (bVar2) {
    pcVar6 = cm::String::c_str(&str);
    if (pcVar6 == (char *)0x0) {
      psVar8 = cm::String::str_abi_cxx11_(&str);
      if (psVar8->_M_string_length == 0) {
        bVar2 = cm::String::is_stable(&str);
        if (bVar2) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&str.string_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::operator<<((ostream *)&std::cout,"testConstructFromNullPtr()\n");
          str.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          str.string_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          str.view_ = (string_view)ZEXT816(0);
          bVar2 = testFromNullPtr(&str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&str.string_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!bVar2) {
            return 1;
          }
          std::operator<<((ostream *)&std::cout,"testConstructFromCStrNull()\n");
          null = (char *)0x0;
          cm::String::String<char_const*&,void>(&str,&null);
          bVar2 = testFromCStrNull(&str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&str.string_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!bVar2) {
            return 1;
          }
          std::operator<<((ostream *)&std::cout,"testConstructFromCharArray()\n");
          cm::String::String<char_const(&)[4],void>(&str,(char (*) [4])"abc");
          bVar2 = testFromCharArray(&str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&str.string_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!bVar2) {
            return 1;
          }
          std::operator<<((ostream *)&std::cout,"testConstructFromCStr()\n");
          cm::String::String<char_const*&,void>(&str,&cstr);
          bVar2 = testFromCStr(&str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&str.string_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!bVar2) {
            return 1;
          }
          std::operator<<((ostream *)&std::cout,"testConstructFromStdString()\n");
          cm::String::String<std::__cxx11::string_const&,void>(&str,&stdstr_abi_cxx11_);
          bVar2 = testFromStdString(&str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&str.string_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!bVar2) {
            return 1;
          }
          std::operator<<((ostream *)&std::cout,"testConstructFromView()\n");
          pcVar6 = cstr;
          null = (char *)strlen(cstr);
          _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar6;
          cm::String::String<std::basic_string_view<char,std::char_traits<char>>&,void>
                    (&str,(basic_string_view<char,_std::char_traits<char>_> *)&null);
          bVar2 = testFromCStr(&str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&str.string_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!bVar2) {
            return 1;
          }
          std::operator<<((ostream *)&std::cout,"testConstructFromChar()\n");
          null = (char *)CONCAT71(null._1_7_,0x61);
          cm::String::String<char,void>(&str,(char *)&null);
          bVar2 = testFromChar(&str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&str.string_.
                      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if (!bVar2) {
            return 1;
          }
          std::operator<<((ostream *)&std::cout,"testConstructFromInitList()\n");
          null = (char *)CONCAT53(null._3_5_,0x636261);
          il._M_len = 3;
          il._M_array = (iterator)&null;
          cm::String::String(&str,il);
          if (str.view_._M_len == 3) {
            if (((*str.view_._M_str == 'a') && (str.view_._M_str[1] == 'b')) &&
               (str.view_._M_str[2] == 'c')) {
              bVar2 = cm::String::is_stable(&str);
              if (bVar2) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&str.string_.
                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::operator<<((ostream *)&std::cout,"testConstructFromBuffer()\n");
                cm::String::String(&str,cstr,3);
                bVar2 = testFromCStr(&str);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&str.string_.
                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                if (!bVar2) {
                  return 1;
                }
                std::operator<<((ostream *)&std::cout,"testConstructFromInputIterator()\n");
                cm::String::String<char_const*>(&str,cstr,cstr + 3);
                if (str.view_._M_str == cstr) {
                  poVar7 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(str.data() != cstr) failed on line ");
                  iVar5 = 0x102;
                }
                else if (str.view_._M_len == 3) {
                  iVar5 = strncmp(str.view_._M_str,cstr,3);
                  if (iVar5 == 0) {
                    bVar2 = cm::String::is_stable(&str);
                    if (bVar2) {
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&str.string_.
                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      std::operator<<((ostream *)&std::cout,"testConstructFromN()\n");
                      cm::String::String(&str,3,'a');
                      if (str.view_._M_len == 3) {
                        if (((*str.view_._M_str == 'a') && (str.view_._M_str[1] == 'a')) &&
                           (str.view_._M_str[2] == 'a')) {
                          bVar2 = cm::String::is_stable(&str);
                          if (bVar2) {
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&str.string_.
                                        super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            std::operator<<((ostream *)&std::cout,
                                            "testConstructFromStaticStringView()\n");
                            str.string_.
                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr = (element_type *)0x0;
                            str.string_.
                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                            ;
                            str.view_ = staticStringView.super_string_view;
                            bVar2 = testFromStaticStringView(&str);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&str.string_.
                                        super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            if (!bVar2) {
                              return 1;
                            }
                            std::operator<<((ostream *)&std::cout,"testConstructCopy()\n");
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&null,"abc",(allocator<char> *)&null_1);
                            cm::String::String<std::__cxx11::string,void>
                                      (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&null);
                            std::__cxx11::string::~string((string *)&null);
                            cm::String::String((String *)&null,&str);
                            if (str.view_._M_str == (char *)local_218._8_8_) {
                              if (str.view_._M_len != 3) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(s1.size() == 3) failed on line ");
                                iVar5 = 0x13b;
                                goto LAB_001391eb;
                              }
                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  local_218._M_allocated_capacity !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(s2.size() == 3) failed on line ");
                                iVar5 = 0x13c;
                                goto LAB_001391eb;
                              }
                              if (((*(char *)local_218._8_8_ != 'a') ||
                                  (*(char *)(local_218._8_8_ + 1) != 'b')) ||
                                 (*(char *)(local_218._8_8_ + 2) != 'c')) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(std::strncmp(s2.data(), \"abc\", 3) == 0) failed on line "
                                                  );
                                iVar5 = 0x13d;
                                goto LAB_001391eb;
                              }
                              bVar2 = cm::String::is_stable(&str);
                              if (!bVar2) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(s1.is_stable()) failed on line ");
                                iVar5 = 0x13e;
                                goto LAB_001391eb;
                              }
                              bVar2 = cm::String::is_stable((String *)&null);
                              if (!bVar2) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(s2.is_stable()) failed on line ");
                                iVar5 = 0x13f;
                                goto LAB_001391eb;
                              }
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&_Stack_220);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&str.string_.
                                          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                              std::operator<<((ostream *)&std::cout,"testConstructMove()\n");
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&null,"abc",(allocator<char> *)&null_1);
                              cm::String::String<std::__cxx11::string,void>
                                        (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&null);
                              std::__cxx11::string::~string((string *)&null);
                              sVar1 = str.view_._M_len;
                              pcVar6 = str.view_._M_str;
                              null = (char *)str.string_.
                                             super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr;
                              _Stack_220._M_pi =
                                   str.string_.
                                   super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                              str.string_.
                              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = (element_type *)0x0;
                              str.string_.
                              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi =
                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              local_218._M_allocated_capacity = str.view_._M_len;
                              local_218._8_8_ = str.view_._M_str;
                              str.view_ = (string_view)ZEXT816(0);
                              if (sVar1 != 3) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(s2.size() == 3) failed on line ");
                                iVar5 = 0x14a;
LAB_0013927d:
                                poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                                std::operator<<(poVar7,"\n");
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                          (&_Stack_220);
                                goto LAB_0013899b;
                              }
                              if (((*pcVar6 != 'a') || (pcVar6[1] != 'b')) || (pcVar6[2] != 'c')) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(std::strncmp(s2.data(), \"abc\", 3) == 0) failed on line "
                                                  );
                                iVar5 = 0x14b;
                                goto LAB_0013927d;
                              }
                              bVar2 = cm::String::is_stable(&str);
                              if (!bVar2) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(s1.is_stable()) failed on line ");
                                iVar5 = 0x14c;
                                goto LAB_0013927d;
                              }
                              bVar2 = cm::String::is_stable((String *)&null);
                              if (!bVar2) {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(s2.is_stable()) failed on line ");
                                iVar5 = 0x14d;
                                goto LAB_0013927d;
                              }
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&_Stack_220);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&str.string_.
                                          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                              std::operator<<((ostream *)&std::cout,"testAssignCopy()\n");
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&null,"abc",(allocator<char> *)&null_1);
                              cm::String::String<std::__cxx11::string,void>
                                        (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&null);
                              std::__cxx11::string::~string((string *)&null);
                              local_218._M_allocated_capacity = 0;
                              local_218._8_8_ = (element_type *)0x0;
                              null = (char *)0x0;
                              _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                              ;
                              cm::String::operator=((String *)&null,&str);
                              if (str.view_._M_str == (char *)local_218._8_8_) {
                                if (str.view_._M_len != 3) {
                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(s1.size() == 3) failed on line ");
                                  iVar5 = 0x158;
                                  goto LAB_00139428;
                                }
                                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    local_218._M_allocated_capacity !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3) {
                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(s2.size() == 3) failed on line ");
                                  iVar5 = 0x159;
                                  goto LAB_00139428;
                                }
                                if (((*(char *)local_218._8_8_ != 'a') ||
                                    (*(char *)(local_218._8_8_ + 1) != 'b')) ||
                                   (*(char *)(local_218._8_8_ + 2) != 'c')) {
                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(std::strncmp(s2.data(), \"abc\", 3) == 0) failed on line "
                                                  );
                                  iVar5 = 0x15a;
                                  goto LAB_00139428;
                                }
                                bVar2 = cm::String::is_stable(&str);
                                if (!bVar2) {
                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(s1.is_stable()) failed on line ");
                                  iVar5 = 0x15b;
                                  goto LAB_00139428;
                                }
                                bVar2 = cm::String::is_stable((String *)&null);
                                if (!bVar2) {
                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(s2.is_stable()) failed on line ");
                                  iVar5 = 0x15c;
                                  goto LAB_00139428;
                                }
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                          (&_Stack_220);
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                          (&str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                                std::operator<<((ostream *)&std::cout,"testAssignMove()\n");
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&null,"abc",(allocator<char> *)&null_1);
                                cm::String::String<std::__cxx11::string,void>
                                          (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&null);
                                std::__cxx11::string::~string((string *)&null);
                                local_218._M_allocated_capacity = 0;
                                local_218._8_8_ = (element_type *)0x0;
                                null = (char *)0x0;
                                _Stack_220._M_pi =
                                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                cm::String::operator=((String *)&null,&str);
                                if (str.view_._M_str == (char *)0x0) {
                                  if (str.view_._M_len == 0) {
                                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_218._M_allocated_capacity ==
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3) {
                                      if (((*(char *)local_218._8_8_ == 'a') &&
                                          (*(char *)(local_218._8_8_ + 1) == 'b')) &&
                                         (*(char *)(local_218._8_8_ + 2) == 'c')) {
                                        bVar2 = cm::String::is_stable(&str);
                                        if (bVar2) {
                                          bVar2 = cm::String::is_stable((String *)&null);
                                          if (bVar2) {
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&_Stack_220);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&str.string_.
                                                                                                                          
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            std::operator<<((ostream *)&std::cout,
                                                            "testAssignFromChar()\n");
                                            str.view_ = (string_view)ZEXT816(0);
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)0x0;
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            null = (char *)CONCAT71(null._1_7_,0x61);
                                            cm::String::operator=(&str,(char *)&null);
                                            bVar2 = testFromChar(&str);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&str.string_.
                                                                                                                          
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            if (!bVar2) {
                                              return 1;
                                            }
                                            std::operator<<((ostream *)&std::cout,
                                                            "testAssignFromView()\n");
                                            pcVar6 = cstr;
                                            null = (char *)strlen(cstr);
                                            _Stack_220._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                 pcVar6;
                                            str.view_ = (string_view)ZEXT816(0);
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)0x0;
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            cm::String::operator=
                                                      (&str,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null);
                                            bVar2 = testFromCStr(&str);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&str.string_.
                                                                                                                          
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            if (!bVar2) {
                                              return 1;
                                            }
                                            std::operator<<((ostream *)&std::cout,
                                                            "testAssignFromStdString()\n");
                                            str.view_ = (string_view)ZEXT816(0);
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)0x0;
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            cm::String::operator=(&str,&stdstr_abi_cxx11_);
                                            bVar2 = testFromStdString(&str);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&str.string_.
                                                                                                                          
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            if (!bVar2) {
                                              return 1;
                                            }
                                            std::operator<<((ostream *)&std::cout,
                                                            "testAssignFromCStr()\n");
                                            str.view_ = (string_view)ZEXT816(0);
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)0x0;
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            cm::String::operator=(&str,&cstr);
                                            bVar2 = testFromCStr(&str);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&str.string_.
                                                                                                                          
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            if (!bVar2) {
                                              return 1;
                                            }
                                            std::operator<<((ostream *)&std::cout,
                                                            "testAssignFromCharArray()\n");
                                            str.view_ = (string_view)ZEXT816(0);
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)0x0;
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            cm::String::operator=(&str,(char (*) [4])"abc");
                                            cm::String::String((String *)&null,&str);
                                            bVar2 = testFromCharArray((String *)&null);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&_Stack_220);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&str.string_.
                                                                                                                          
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            if (!bVar2) {
                                              return 1;
                                            }
                                            std::operator<<((ostream *)&std::cout,
                                                            "testAssignFromCStrNull()\n");
                                            null_1 = (char *)0x0;
                                            str.view_ = (string_view)ZEXT816(0);
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)0x0;
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            cm::String::operator=(&str,&null_1);
                                            cm::String::String((String *)&null,&str);
                                            bVar2 = testFromCStrNull((String *)&null);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&_Stack_220);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&str.string_.
                                                                                                                          
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            if (!bVar2) {
                                              return 1;
                                            }
                                            std::operator<<((ostream *)&std::cout,
                                                            "testAssignFromNullPtr()\n");
                                            str.view_ = (string_view)ZEXT816(0);
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)0x0;
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            null = (char *)0x0;
                                            cm::String::operator=(&str,&null);
                                            cm::String::String((String *)&null,&str);
                                            bVar2 = testFromNullPtr((String *)&null);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&_Stack_220);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(&str.string_.
                                                                                                                          
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            if (!bVar2) {
                                              return 1;
                                            }
                                            std::operator<<((ostream *)&std::cout,
                                                            "testAssignFromInitList()\n");
                                            str.view_ = (string_view)ZEXT816(0);
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr = (element_type *)0x0;
                                            str.string_.
                                            super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi =
                                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                            ;
                                            null = (char *)CONCAT53(null._3_5_,0x636261);
                                            il_00._M_len = 3;
                                            il_00._M_array = (iterator)&null;
                                            cm::String::operator=(&str,il_00);
                                            if (str.view_._M_len == 3) {
                                              if (((*str.view_._M_str == 'a') &&
                                                  (str.view_._M_str[1] == 'b')) &&
                                                 (str.view_._M_str[2] == 'c')) {
                                                bVar2 = cm::String::is_stable(&str);
                                                if (bVar2) {
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&str.string_.
                                                                                                                                      
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::operator<<((ostream *)&std::cout,
                                                                                                                                    
                                                  "testAssignFromStaticStringView()\n");
                                                  str.view_ = (string_view)ZEXT816(0);
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)0x0;
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x0;
                                                  cm::String::operator=(&str,&staticStringView);
                                                  cm::String::String((String *)&null,&str);
                                                  bVar2 = testFromStaticStringView((String *)&null);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&_Stack_220);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&str.string_.
                                                                                                                                      
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (!bVar2) {
                                                    return 1;
                                                  }
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testOperatorBool()\n");
                                                  str.view_ = (string_view)ZEXT816(0);
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)0x0;
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x0;
                                                  cm::String::operator=(&str,(char (*) [1])0x428bbe)
                                                  ;
                                                  if (str.view_._M_str == (char *)0x0) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str) failed on line ");
                                                  iVar5 = 0x175;
                                                  }
                                                  else {
                                                    null = (char *)0x0;
                                                    cm::String::operator=(&str,&null);
                                                    if (str.view_._M_str == (char *)0x0) {
                                                      null = (char *)&local_218;
                                                      _Stack_220._M_pi =
                                                           (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ;
                                                  local_218._M_allocated_capacity =
                                                       local_218._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  cm::String::operator=
                                                            (&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  std::__cxx11::string::~string((string *)&null);
                                                  if (str.view_._M_str == (char *)0x0) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str) failed on line ");
                                                  iVar5 = 0x179;
                                                  }
                                                  else {
                                                    null = (char *)0x0;
                                                    cm::String::operator=(&str,&null);
                                                    if (str.view_._M_str == (char *)0x0) {
                                                      std::
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&str.string_.
                                                                                                                                      
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testOperatorIndex()\n");
                                                  cm::String::String<char_const(&)[4],void>
                                                            (&str,(char (*) [4])"abc");
                                                  if (*str.view_._M_str == 'a') {
                                                    if (str.view_._M_str[1] == 'b') {
                                                      if (str.view_._M_str[2] == 'c') {
                                                        std::
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&str.string_.
                                                                                                                                      
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testOperatorPlusEqual()\n");
                                                  cm::String::String<char_const(&)[2],void>
                                                            (&str,(char (*) [2])0x3fb454);
                                                  cm::String::operator+=
                                                            (&str,(char (*) [2])0x41fd2d);
                                                  null = "c";
                                                  cm::String::operator+=(&str,&null);
                                                  null = (char *)CONCAT71(null._1_7_,100);
                                                  cm::String::operator+=(&str,(char *)&null);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&null,"e",
                                                             (allocator<char> *)&null_1);
                                                  cm::String::operator+=
                                                            (&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  std::__cxx11::string::~string((string *)&null);
                                                  null = (char *)0x1;
                                                  _Stack_220._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x3eccd9;
                                                  cm::String::operator+=
                                                            (&str,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null);
                                                  cm::String::String<char_const(&)[2],void>
                                                            ((String *)&null,(char (*) [2])0x40c187)
                                                  ;
                                                  cm::String::operator+=(&str,(String *)&null);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&_Stack_220);
                                                  if (str.view_._M_len == 7) {
                                                    iVar5 = strncmp(str.view_._M_str,"abcdefg",7);
                                                    if (iVar5 == 0) {
                                                      bVar2 = cm::String::is_stable(&str);
                                                      if (bVar2) {
                                                        std::
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&str.string_.
                                                                                                                                      
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testOperatorCompare()\n");
                                                  cm::String::String<char_const(&)[2],void>
                                                            (&str,(char (*) [2])0x41fd2d);
                                                  tVar3 = cm::operator==(&str,(char (*) [2])0x41fd2d
                                                                        );
                                                  if (tVar3) {
                                                    tVar3 = cm::operator==((char (*) [2])0x41fd2d,
                                                                           &str);
                                                    if (tVar3) {
                                                      tVar3 = cm::operator!=(&str,(char (*) [2])
                                                                                  0x3fb454);
                                                      if (tVar3) {
                                                        tVar3 = cm::operator!=((char (*) [2])
                                                                               0x3fb454,&str);
                                                        if (tVar3) {
                                                          tVar3 = cm::operator<(&str,(char (*) [2])
                                                                                     0x446697);
                                                          if (tVar3) {
                                                            tVar3 = cm::operator<((char (*) [2])
                                                                                  0x3fb454,&str);
                                                            if (tVar3) {
                                                              tVar3 = cm::operator>(&str,(char (*) [
                                                  2])0x3fb454);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>((char (*) [2])0x446697,
                                                                          &str);
                                                    if (tVar3) {
                                                      tVar3 = cm::operator<=(&str,(char (*) [2])
                                                                                  0x41fd2d);
                                                      if (tVar3) {
                                                        tVar3 = cm::operator<=((char (*) [2])
                                                                               0x41fd2d,&str);
                                                        if (tVar3) {
                                                          tVar3 = cm::operator>=(&str,(char (*) [2])
                                                                                      0x41fd2d);
                                                          if (tVar3) {
                                                            tVar3 = cm::operator>=((char (*) [2])
                                                                                   0x41fd2d,&str);
                                                            if (tVar3) {
                                                              null = "a";
                                                              null_1 = "b";
                                                              c_1 = "c";
                                                              tVar3 = cm::operator==(&str,&null_1);
                                                              if (tVar3) {
                                                                tVar3 = cm::operator==(&null_1,&str)
                                                                ;
                                                                if (tVar3) {
                                                                  tVar3 = cm::operator!=(&str,&null)
                                                                  ;
                                                                  if (tVar3) {
                                                                    tVar3 = cm::operator!=(&null,&
                                                  str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<(&str,&c_1);
                                                    if (tVar3) {
                                                      tVar3 = cm::operator<(&null,&str);
                                                      if (tVar3) {
                                                        tVar3 = cm::operator>(&str,&null);
                                                        if (tVar3) {
                                                          tVar3 = cm::operator>(&c_1,&str);
                                                          if (tVar3) {
                                                            tVar3 = cm::operator<=(&str,&null_1);
                                                            if (tVar3) {
                                                              tVar3 = cm::operator<=(&null_1,&str);
                                                              if (tVar3) {
                                                                tVar3 = cm::operator>=(&str,&null_1)
                                                                ;
                                                                if (tVar3) {
                                                                  tVar3 = cm::operator>=(&null_1,&
                                                  str);
                                                  if (tVar3) {
                                                    null = (char *)CONCAT71(null._1_7_,0x62);
                                                    tVar3 = cm::operator==(&str,(char *)&null);
                                                    if (tVar3) {
                                                      null = (char *)CONCAT71(null._1_7_,0x62);
                                                      tVar3 = cm::operator==((char *)&null,&str);
                                                      if (tVar3) {
                                                        null = (char *)CONCAT71(null._1_7_,0x61);
                                                        tVar3 = cm::operator!=(&str,(char *)&null);
                                                        if (tVar3) {
                                                          null = (char *)CONCAT71(null._1_7_,0x61);
                                                          tVar3 = cm::operator!=((char *)&null,&str)
                                                          ;
                                                          if (tVar3) {
                                                            null = (char *)CONCAT71(null._1_7_,99);
                                                            tVar3 = cm::operator<(&str,(char *)&null
                                                                                 );
                                                            if (tVar3) {
                                                              null = (char *)CONCAT71(null._1_7_,
                                                                                      0x61);
                                                              tVar3 = cm::operator<((char *)&null,
                                                                                    &str);
                                                              if (tVar3) {
                                                                null = (char *)CONCAT71(null._1_7_,
                                                                                        0x61);
                                                                tVar3 = cm::operator>(&str,(char *)&
                                                  null);
                                                  if (tVar3) {
                                                    null = (char *)CONCAT71(null._1_7_,99);
                                                    tVar3 = cm::operator>((char *)&null,&str);
                                                    if (tVar3) {
                                                      null = (char *)CONCAT71(null._1_7_,0x62);
                                                      tVar3 = cm::operator<=(&str,(char *)&null);
                                                      if (tVar3) {
                                                        null = (char *)CONCAT71(null._1_7_,0x62);
                                                        tVar3 = cm::operator<=((char *)&null,&str);
                                                        if (tVar3) {
                                                          null = (char *)CONCAT71(null._1_7_,0x62);
                                                          tVar3 = cm::operator>=(&str,(char *)&null)
                                                          ;
                                                          if (tVar3) {
                                                            null = (char *)CONCAT71(null._1_7_,0x62)
                                                            ;
                                                            tVar3 = cm::operator>=((char *)&null,
                                                                                   &str);
                                                            if (tVar3) {
                                                              std::__cxx11::string::
                                                              string<std::allocator<char>>
                                                                        ((string *)&null,"a",
                                                                         (allocator<char> *)&null_1)
                                                              ;
                                                              std::__cxx11::string::
                                                              string<std::allocator<char>>
                                                                        ((string *)&null_1,"b",
                                                                         (allocator<char> *)&c_1);
                                                              std::__cxx11::string::
                                                              string<std::allocator<char>>
                                                                        ((string *)&c_1,"c",
                                                                         &local_69);
                                                              tVar3 = cm::operator==(&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null_1);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null_1,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator!=(&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<(&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&c_1);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>(&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&c_1,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<=(&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null_1);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null_1,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>=(&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null_1);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null_1,&str);
                                                  if (tVar3) {
                                                    std::__cxx11::string::~string((string *)&c_1);
                                                    std::__cxx11::string::~string((string *)&null_1)
                                                    ;
                                                    std::__cxx11::string::~string((string *)&null);
                                                    null = (char *)0x1;
                                                    _Stack_220._M_pi =
                                                         (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x3fb454;
                                                  null_1 = (char *)0x1;
                                                  local_200[0]._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x41fd2d;
                                                  c_1 = (char *)0x1;
                                                  local_60[0]._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x446697;
                                                  tVar3 = cm::operator==(&str,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null_1);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator==((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null_1,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator!=(&str,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator!=((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<(&str,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&c_1);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>(&str,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&c_1,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<=(&str,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null_1);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator<=((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null_1,&str);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>=(&str,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null_1);
                                                  if (tVar3) {
                                                    tVar3 = cm::operator>=((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&null_1,&str);
                                                  if (tVar3) {
                                                    cm::String::String<char_const(&)[2],void>
                                                              ((String *)&null,
                                                               (char (*) [2])0x3fb454);
                                                    cm::String::String<char_const(&)[2],void>
                                                              ((String *)&null_1,
                                                               (char (*) [2])0x41fd2d);
                                                    cm::String::String<char_const(&)[2],void>
                                                              ((String *)&c_1,(char (*) [2])0x446697
                                                              );
                                                    tVar3 = cm::operator==(&str,(String *)&null_1);
                                                    if (tVar3) {
                                                      tVar3 = cm::operator==((String *)&null_1,&str)
                                                      ;
                                                      if (!tVar3) {
                                                        poVar7 = std::operator<<((ostream *)
                                                                                 &std::cout,
                                                                                                                                                                  
                                                  "ASSERT_TRUE(b == str) failed on line ");
                                                  iVar5 = 500;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator!=(&str,(String *)&null);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str != a) failed on line ");
                                                  iVar5 = 0x1f5;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator!=((String *)&null,&str);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(a != str) failed on line ");
                                                  iVar5 = 0x1f6;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator<(&str,(String *)&c_1);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str < c) failed on line ");
                                                  iVar5 = 0x1f7;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator<((String *)&null,&str);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(a < str) failed on line ");
                                                  iVar5 = 0x1f8;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator>(&str,(String *)&null);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str > a) failed on line ");
                                                  iVar5 = 0x1f9;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator>((String *)&c_1,&str);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(c > str) failed on line ");
                                                  iVar5 = 0x1fa;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator<=(&str,(String *)&null_1);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str <= b) failed on line ");
                                                  iVar5 = 0x1fb;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator<=((String *)&null_1,&str);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(b <= str) failed on line ");
                                                  iVar5 = 0x1fc;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator>=(&str,(String *)&null_1);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str >= b) failed on line ");
                                                  iVar5 = 0x1fd;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  tVar3 = cm::operator>=((String *)&null_1,&str);
                                                  bVar2 = true;
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(b >= str) failed on line ");
                                                  iVar5 = 0x1fe;
                                                  goto LAB_0013ad2d;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str == b) failed on line ");
                                                  iVar5 = 499;
LAB_0013ad2d:
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  bVar2 = false;
                                                  }
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(local_60);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(local_200);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&_Stack_220);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&str.string_.
                                                                                                                                      
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (!bVar2) {
                                                    return 1;
                                                  }
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testOperatorStream()\n");
                                                  std::__cxx11::ostringstream::ostringstream
                                                            ((ostringstream *)&str);
                                                  poVar7 = std::operator<<((ostream *)&str,"a");
                                                  cm::String::String<char_const(&)[2],void>
                                                            ((String *)&null,(char (*) [2])0x41fd2d)
                                                  ;
                                                  poVar7 = cm::operator<<(poVar7,(String *)&null);
                                                  std::operator<<(poVar7,'c');
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&_Stack_220);
                                                  std::__cxx11::stringbuf::str();
                                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null,"abc");
                                                  std::__cxx11::string::~string((string *)&null);
                                                  if (!bVar2) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(ss.str() == \"abc\") failed on line "
                                                  );
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,0x208);
                                                  std::operator<<(poVar7,"\n");
                                                  std::__cxx11::ostringstream::~ostringstream
                                                            ((ostringstream *)&str);
                                                  return 1;
                                                  }
                                                  std::__cxx11::ostringstream::~ostringstream
                                                            ((ostringstream *)&str);
                                                  std::operator<<((ostream *)&std::cout,
                                                                                                                                    
                                                  "testOperatorStdStringPlusEqual()\n");
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&str,"a",
                                                             (allocator<char> *)&null);
                                                  cm::String::String<char_const(&)[2],void>
                                                            ((String *)&null,(char (*) [2])0x41fd2d)
                                                  ;
                                                  cm::operator+=((string *)&str,(String *)&null);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&_Stack_220);
                                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&str,"ab");
                                                  if (!bVar2) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(s == \"ab\") failed on line ");
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,0x211);
                                                  std::operator<<(poVar7,"\n");
LAB_0013b0bc:
                                                  std::__cxx11::string::~string((string *)&str);
                                                  return 1;
                                                  }
                                                  std::__cxx11::string::~string((string *)&str);
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testMethod_borrow()\n");
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&str,"abc",
                                                             (allocator<char> *)&null);
                                                  null = (char *)0x0;
                                                  _Stack_220._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x0;
                                                  local_218._M_allocated_capacity =
                                                       (size_type)
                                                       str.string_.
                                                                                                              
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                                  local_218._8_8_ =
                                                       str.string_.
                                                                                                              
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  tVar3 = cm::operator==((String *)&null,
                                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&str);
                                                  if (!tVar3) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str == s) failed on line ");
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,0x21c);
                                                  std::operator<<(poVar7,"\n");
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&_Stack_220);
                                                  goto LAB_0013b0bc;
                                                  }
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&_Stack_220);
                                                  std::__cxx11::string::~string((string *)&str);
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testMethod_view()\n");
                                                  str.view_ = (string_view)ZEXT816(0);
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)0x0;
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x0;
                                                  cm::String::operator=(&str,(char (*) [4])"abc");
                                                  if (str.view_._M_str == "abc") {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.view().data() != charArray) failed on line "
                                                  );
                                                  iVar5 = 0x227;
                                                  }
                                                  else if (str.view_._M_len == 3) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&null,"abc",
                                                               (allocator<char> *)&null_1);
                                                    cm::String::operator=
                                                              (&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  std::__cxx11::string::~string((string *)&null);
                                                  if (str.view_._M_len == 3) {
                                                    if (((*str.view_._M_str == 'a') &&
                                                        (str.view_._M_str[1] == 'b')) &&
                                                       (str.view_._M_str[2] == 'c')) {
                                                      std::
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&str.string_.
                                                                                                                                      
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testMethod_empty()\n");
                                                  str.view_ = (string_view)ZEXT816(0);
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)0x0;
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x0;
                                                  cm::String::operator=(&str,(char (*) [1])0x428bbe)
                                                  ;
                                                  if (str.view_._M_len == 0) {
                                                    cm::String::operator=(&str,(char (*) [4])"abc");
                                                    if (str.view_._M_len == 0) {
                                                      poVar7 = std::operator<<((ostream *)&std::cout
                                                                               ,
                                                  "ASSERT_TRUE(!str.empty()) failed on line ");
                                                  iVar5 = 0x237;
                                                  }
                                                  else {
                                                    null = (char *)&local_218;
                                                    _Stack_220._M_pi =
                                                         (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ;
                                                  local_218._M_allocated_capacity =
                                                       local_218._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  cm::String::operator=
                                                            (&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  std::__cxx11::string::~string((string *)&null);
                                                  if (str.view_._M_len == 0) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&null,"abc",
                                                               (allocator<char> *)&null_1);
                                                    cm::String::operator=
                                                              (&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  std::__cxx11::string::~string((string *)&null);
                                                  if (str.view_._M_len != 0) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(&str.string_.
                                                                                                                                              
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testMethod_length()\n");
                                                  str.view_ = (string_view)ZEXT816(0);
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)0x0;
                                                  str.string_.
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x0;
                                                  cm::String::operator=(&str,(char (*) [1])0x428bbe)
                                                  ;
                                                  if (str.view_._M_len == 0) {
                                                    cm::String::operator=(&str,(char (*) [4])"abc");
                                                    if (str.view_._M_len == 3) {
                                                      null = (char *)&local_218;
                                                      _Stack_220._M_pi =
                                                           (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ;
                                                  local_218._M_allocated_capacity =
                                                       local_218._M_allocated_capacity &
                                                       0xffffffffffffff00;
                                                  cm::String::operator=
                                                            (&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  std::__cxx11::string::~string((string *)&null);
                                                  if (str.view_._M_len == 0) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&null,"abc",
                                                               (allocator<char> *)&null_1);
                                                    cm::String::operator=
                                                              (&str,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&null);
                                                  std::__cxx11::string::~string((string *)&null);
                                                  if (str.view_._M_len == 3) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(&str.string_.
                                                                                                                                              
                                                  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "testMethod_at()\n");
                                                  cm::String::String<char_const(&)[4],void>
                                                            (&str,(char (*) [4])"abc");
                                                  cVar4 = cm::String::at(&str,0);
                                                  if (cVar4 == 'a') {
                                                    cVar4 = cm::String::at(&str,1);
                                                    if (cVar4 == 'b') {
                                                      cVar4 = cm::String::at(&str,2);
                                                      if (cVar4 == 'c') {
                                                        cm::String::at(&str,3);
                                                        poVar7 = std::operator<<((ostream *)
                                                                                 &std::cout,
                                                                                                                                                                  
                                                  "ASSERT_TRUE(except_out_of_range) failed on line "
                                                  );
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,0x25c);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(str.at(2) == \'c\') failed on line ")
                                                  ;
                                                  iVar5 = 0x255;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.at(1) == \'b\') failed on line ")
                                                  ;
                                                  iVar5 = 0x254;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.at(0) == \'a\') failed on line ")
                                                  ;
                                                  iVar5 = 0x253;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(str.length() == 3) failed on line ");
                                                  iVar5 = 0x24b;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.length() == 0) failed on line ");
                                                  iVar5 = 0x249;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.length() == 3) failed on line ");
                                                  iVar5 = 0x247;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.length() == 0) failed on line ");
                                                  iVar5 = 0x245;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(!str.empty()) failed on line ");
                                                  iVar5 = 0x23b;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.empty()) failed on line ");
                                                  iVar5 = 0x239;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.empty()) failed on line ");
                                                  iVar5 = 0x235;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(strncmp(str.view().data(), \"abc\", 3) == 0) failed on line "
                                                  );
                                                  iVar5 = 0x22b;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.view().size() == 3) failed on line "
                                                  );
                                                  iVar5 = 0x22a;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.view().size() == sizeof(charArray) - 1) failed on line "
                                                  );
                                                  iVar5 = 0x228;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(b >= str) failed on line ");
                                                  iVar5 = 0x1ed;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str >= b) failed on line ");
                                                  iVar5 = 0x1ec;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(b <= str) failed on line ");
                                                  iVar5 = 0x1eb;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str <= b) failed on line ");
                                                  iVar5 = 0x1ea;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(c > str) failed on line ");
                                                  iVar5 = 0x1e9;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str > a) failed on line ");
                                                  iVar5 = 0x1e8;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(a < str) failed on line ");
                                                  iVar5 = 0x1e7;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str < c) failed on line ");
                                                  iVar5 = 0x1e6;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(a != str) failed on line ");
                                                  iVar5 = 0x1e5;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str != a) failed on line ");
                                                  iVar5 = 0x1e4;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(b == str) failed on line ");
                                                  iVar5 = 0x1e3;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str == b) failed on line ");
                                                  iVar5 = 0x1e2;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(b >= str) failed on line ");
                                                  iVar5 = 0x1dc;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str >= b) failed on line ");
                                                  iVar5 = 0x1db;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(b <= str) failed on line ");
                                                  iVar5 = 0x1da;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str <= b) failed on line ");
                                                  iVar5 = 0x1d9;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(c > str) failed on line ");
                                                  iVar5 = 0x1d8;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str > a) failed on line ");
                                                  iVar5 = 0x1d7;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(a < str) failed on line ");
                                                  iVar5 = 0x1d6;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str < c) failed on line ");
                                                  iVar5 = 0x1d5;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(a != str) failed on line ");
                                                  iVar5 = 0x1d4;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str != a) failed on line ");
                                                  iVar5 = 0x1d3;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(b == str) failed on line ");
                                                  iVar5 = 0x1d2;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str == b) failed on line ");
                                                  iVar5 = 0x1d1;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  std::__cxx11::string::~string((string *)&c_1);
                                                  std::__cxx11::string::~string((string *)&null_1);
                                                  std::__cxx11::string::~string((string *)&null);
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(\'b\' >= str) failed on line ");
                                                  iVar5 = 0x1cb;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str >= \'b\') failed on line ");
                                                  iVar5 = 0x1ca;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\'b\' <= str) failed on line ");
                                                  iVar5 = 0x1c9;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str <= \'b\') failed on line ");
                                                  iVar5 = 0x1c8;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\'c\' > str) failed on line ");
                                                  iVar5 = 0x1c7;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str > \'a\') failed on line ");
                                                  iVar5 = 0x1c6;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\'a\' < str) failed on line ");
                                                  iVar5 = 0x1c5;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str < \'c\') failed on line ");
                                                  iVar5 = 0x1c4;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\'a\' != str) failed on line ");
                                                  iVar5 = 0x1c3;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str != \'a\') failed on line ");
                                                  iVar5 = 0x1c2;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\'b\' == str) failed on line ");
                                                  iVar5 = 0x1c1;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str == \'b\') failed on line ");
                                                  iVar5 = 0x1c0;
                                                  }
                                                  goto LAB_0013a8f4;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(b >= str) failed on line ");
                                                  iVar5 = 0x1bd;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str >= b) failed on line ");
                                                  iVar5 = 0x1bc;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(b <= str) failed on line ");
                                                  iVar5 = 0x1bb;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str <= b) failed on line ");
                                                  iVar5 = 0x1ba;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(c > str) failed on line ");
                                                  iVar5 = 0x1b9;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str > a) failed on line ");
                                                  iVar5 = 0x1b8;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(a < str) failed on line ");
                                                  iVar5 = 0x1b7;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str < c) failed on line ");
                                                  iVar5 = 0x1b6;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(a != str) failed on line ");
                                                  iVar5 = 0x1b5;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str != a) failed on line ");
                                                  iVar5 = 0x1b4;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(b == str) failed on line ");
                                                  iVar5 = 0x1b3;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str == b) failed on line ");
                                                  iVar5 = 0x1b2;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(\"b\" >= str) failed on line ");
                                                  iVar5 = 0x1ac;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str >= \"b\") failed on line ");
                                                  iVar5 = 0x1ab;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\"b\" <= str) failed on line ");
                                                  iVar5 = 0x1aa;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str <= \"b\") failed on line ");
                                                  iVar5 = 0x1a9;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\"c\" > str) failed on line ");
                                                  iVar5 = 0x1a8;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str > \"a\") failed on line ");
                                                  iVar5 = 0x1a7;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\"a\" < str) failed on line ");
                                                  iVar5 = 0x1a6;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str < \"c\") failed on line ");
                                                  iVar5 = 0x1a5;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\"a\" != str) failed on line ");
                                                  iVar5 = 0x1a4;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str != \"a\") failed on line ");
                                                  iVar5 = 0x1a3;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(\"b\" == str) failed on line ");
                                                  iVar5 = 0x1a2;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str == \"b\") failed on line ");
                                                  iVar5 = 0x1a1;
                                                  }
LAB_0013a8f4:
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(str.is_stable()) failed on line ");
                                                  iVar5 = 0x198;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(std::strncmp(str.data(), \"abcdefg\", 7) == 0) failed on line "
                                                  );
                                                  iVar5 = 0x197;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str.size() == 7) failed on line ");
                                                  iVar5 = 0x196;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(str[2] == \'c\') failed on line ");
                                                  iVar5 = 0x185;
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str[1] == \'b\') failed on line ");
                                                  iVar5 = 0x184;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(str[0] == \'a\') failed on line ");
                                                  iVar5 = 0x183;
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                  }
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE(!str) failed on line ");
                                                  iVar5 = 0x17b;
                                                  }
                                                  }
                                                  else {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(!str) failed on line ");
                                                  iVar5 = 0x177;
                                                  }
                                                  }
                                                  poVar7 = (ostream *)
                                                           std::ostream::operator<<(poVar7,iVar5);
                                                  std::operator<<(poVar7,"\n");
                                                  goto LAB_0013899b;
                                                }
                                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                  
                                                  "ASSERT_TRUE(str.is_stable()) failed on line ");
                                                iVar5 = 0xf3;
                                              }
                                              else {
                                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                  
                                                  "ASSERT_TRUE(std::strncmp(str.data(), \"abc\", 3) == 0) failed on line "
                                                  );
                                                iVar5 = 0xf2;
                                              }
                                            }
                                            else {
                                              poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                              
                                                  "ASSERT_TRUE(str.size() == 3) failed on line ");
                                              iVar5 = 0xf1;
                                            }
                                            poVar7 = (ostream *)
                                                     std::ostream::operator<<(poVar7,iVar5);
                                            std::operator<<(poVar7,"\n");
                                            goto LAB_0013899b;
                                          }
                                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                      
                                                  "ASSERT_TRUE(s2.is_stable()) failed on line ");
                                          iVar5 = 0x16b;
                                        }
                                        else {
                                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                      
                                                  "ASSERT_TRUE(s1.is_stable()) failed on line ");
                                          iVar5 = 0x16a;
                                        }
                                      }
                                      else {
                                        poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                  
                                                  "ASSERT_TRUE(std::strncmp(s2.data(), \"abc\", 3) == 0) failed on line "
                                                  );
                                        iVar5 = 0x169;
                                      }
                                    }
                                    else {
                                      poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                              
                                                  "ASSERT_TRUE(s2.size() == 3) failed on line ");
                                      iVar5 = 0x168;
                                    }
                                  }
                                  else {
                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(s1.size() == 0) failed on line ");
                                    iVar5 = 0x167;
                                  }
                                }
                                else {
                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(s1.data() == nullptr) failed on line "
                                                  );
                                  iVar5 = 0x166;
                                }
                                poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                                std::operator<<(poVar7,"\n");
                              }
                              else {
                                poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(s1.data() == s2.data()) failed on line "
                                                  );
                                iVar5 = 0x157;
LAB_00139428:
                                poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                                std::operator<<(poVar7,"\n");
                              }
                            }
                            else {
                              poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(s1.data() == s2.data()) failed on line "
                                                  );
                              iVar5 = 0x13a;
LAB_001391eb:
                              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                              std::operator<<(poVar7,"\n");
                            }
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&_Stack_220);
                            goto LAB_0013899b;
                          }
                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                   "ASSERT_TRUE(str.is_stable()) failed on line ");
                          iVar5 = 0x10f;
                        }
                        else {
                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(std::strncmp(str.data(), \"aaa\", 3) == 0) failed on line "
                                                  );
                          iVar5 = 0x10e;
                        }
                      }
                      else {
                        poVar7 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(str.size() == 3) failed on line ");
                        iVar5 = 0x10d;
                      }
                      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                      std::operator<<(poVar7,"\n");
                      goto LAB_0013899b;
                    }
                    poVar7 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(str.is_stable()) failed on line ");
                    iVar5 = 0x105;
                  }
                  else {
                    poVar7 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(std::strncmp(str.data(), cstr, 3) == 0) failed on line "
                                            );
                    iVar5 = 0x104;
                  }
                }
                else {
                  poVar7 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(str.size() == 3) failed on line ");
                  iVar5 = 0x103;
                }
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
                std::operator<<(poVar7,"\n");
                goto LAB_0013899b;
              }
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(str.is_stable()) failed on line ");
              iVar5 = 0xe8;
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(std::strncmp(str.data(), \"abc\", 3) == 0) failed on line "
                                      );
              iVar5 = 0xe7;
            }
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(str.size() == 3) failed on line ");
            iVar5 = 0xe6;
          }
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
          std::operator<<(poVar7,"\n");
          goto LAB_0013899b;
        }
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(str.is_stable()) failed on line ");
        iVar5 = 0x26;
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(str.str().empty()) failed on line ");
        iVar5 = 0x25;
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(str.c_str() == nullptr) failed on line ");
      iVar5 = 0x24;
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str_const.is_stable()) failed on line ");
    iVar5 = 0x23;
  }
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
  std::operator<<(poVar7,"\n");
LAB_0013899b:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&str.string_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return 1;
}

Assistant:

static bool testConstructDefault()
{
  std::cout << "testConstructDefault()\n";
  cm::String str;
  cm::String const& str_const = str;
  ASSERT_TRUE(bool(str_const) == false);
  ASSERT_TRUE(str_const.data() == nullptr);
  ASSERT_TRUE(str_const.size() == 0);
  ASSERT_TRUE(str_const.empty());
  ASSERT_TRUE(str_const.is_stable());
  ASSERT_TRUE(str.c_str() == nullptr);
  ASSERT_TRUE(str.str().empty());
  ASSERT_TRUE(str.is_stable());
  return true;
}